

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QOpenGLVersionProfile,_QAbstractOpenGLFunctions_*>_>::
addStorage(Span<QHashPrivate::Node<QOpenGLVersionProfile,_QAbstractOpenGLFunctions_*>_> *this)

{
  byte bVar1;
  Entry *pEVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Entry *pEVar11;
  uchar *puVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  int iVar42;
  undefined1 auVar40 [16];
  int iVar43;
  undefined1 auVar41 [16];
  int iVar44;
  int iVar55;
  int iVar56;
  int iVar57;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  int iVar68;
  undefined1 auVar67 [16];
  int iVar69;
  long lVar70;
  long lVar78;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  long lVar79;
  long lVar80;
  
  bVar1 = this->allocated;
  if (bVar1 == 0) {
    lVar16 = 0x30;
  }
  else if (bVar1 == 0x30) {
    lVar16 = 0x50;
  }
  else {
    lVar16 = (ulong)bVar1 + 0x10;
  }
  pEVar11 = (Entry *)operator_new__((ulong)((uint)lVar16 << 4));
  uVar17 = (ulong)this->allocated;
  if (uVar17 != 0) {
    lVar14 = 0;
    uVar15 = 0;
    do {
      pEVar2 = this->entries;
      QOpenGLVersionProfile::QOpenGLVersionProfile
                ((QOpenGLVersionProfile *)((pEVar11->storage).data + lVar14),
                 (QOpenGLVersionProfile *)((pEVar2->storage).data + lVar14));
      *(undefined8 *)((pEVar11->storage).data + lVar14 + 8) =
           *(undefined8 *)((pEVar2->storage).data + lVar14 + 8);
      QOpenGLVersionProfile::~QOpenGLVersionProfile
                ((QOpenGLVersionProfile *)((this->entries->storage).data + lVar14));
      uVar15 = uVar15 + 1;
      uVar17 = (ulong)this->allocated;
      lVar14 = lVar14 + 0x10;
    } while (uVar15 < uVar17);
  }
  if ((uint)uVar17 < (uint)lVar16) {
    lVar14 = lVar16 - uVar17;
    lVar13 = lVar14 + -1;
    lVar70 = uVar17 + 0xe;
    lVar78 = uVar17 + 0xf;
    lVar28 = uVar17 + 0xc;
    lVar29 = uVar17 + 0xd;
    lVar30 = uVar17 + 10;
    lVar31 = uVar17 + 0xb;
    lVar32 = uVar17 + 8;
    lVar33 = uVar17 + 9;
    lVar34 = uVar17 + 6;
    lVar35 = uVar17 + 7;
    lVar36 = uVar17 + 4;
    lVar37 = uVar17 + 5;
    lVar79 = uVar17 + 2;
    lVar80 = uVar17 + 3;
    lVar18 = uVar17 + 1;
    auVar19._8_4_ = (int)lVar13;
    auVar19._0_8_ = lVar13;
    auVar19._12_4_ = (int)((ulong)lVar13 >> 0x20);
    puVar12 = pEVar11[0xf].storage.data + ((uint)uVar17 << 4);
    uVar15 = 0;
    do {
      auVar67._8_4_ = (int)uVar15;
      auVar67._0_8_ = uVar15;
      auVar67._12_4_ = (int)(uVar15 >> 0x20);
      auVar40 = auVar19 ^ _DAT_00179220;
      auVar38 = (auVar67 | _DAT_00179210) ^ _DAT_00179220;
      iVar68 = auVar40._0_4_;
      iVar44 = -(uint)(iVar68 < auVar38._0_4_);
      iVar69 = auVar40._4_4_;
      iVar55 = -(uint)(iVar69 < auVar38._4_4_);
      iVar42 = auVar40._8_4_;
      iVar56 = -(uint)(iVar42 < auVar38._8_4_);
      iVar43 = auVar40._12_4_;
      iVar57 = -(uint)(iVar43 < auVar38._12_4_);
      auVar71._4_4_ = iVar44;
      auVar71._0_4_ = iVar44;
      auVar71._8_4_ = iVar56;
      auVar71._12_4_ = iVar56;
      auVar63 = pshuflw(in_XMM12,auVar71,0xe8);
      auVar45._4_4_ = -(uint)(auVar38._4_4_ == iVar69);
      auVar45._12_4_ = -(uint)(auVar38._12_4_ == iVar43);
      auVar45._0_4_ = auVar45._4_4_;
      auVar45._8_4_ = auVar45._12_4_;
      auVar58 = pshuflw(in_XMM10,auVar45,0xe8);
      auVar39._4_4_ = iVar55;
      auVar39._0_4_ = iVar55;
      auVar39._8_4_ = iVar57;
      auVar39._12_4_ = iVar57;
      auVar40 = pshuflw(_DAT_00179220,auVar39,0xe8);
      auVar38._8_4_ = 0xffffffff;
      auVar38._0_8_ = 0xffffffffffffffff;
      auVar38._12_4_ = 0xffffffff;
      auVar38 = (auVar40 | auVar58 & auVar63) ^ auVar38;
      auVar38 = packssdw(auVar38,auVar38);
      if ((auVar38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        puVar12[-0xf0] = (char)uVar17 + '\x01';
      }
      auVar39 = auVar45 & auVar71 | auVar39;
      auVar38 = packssdw(auVar39,auVar39);
      auVar40._8_4_ = 0xffffffff;
      auVar40._0_8_ = 0xffffffffffffffff;
      auVar40._12_4_ = 0xffffffff;
      auVar38 = packssdw(auVar38 ^ auVar40,auVar38 ^ auVar40);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38._0_4_ >> 8 & 1) != 0) {
        puVar12[-0xe0] = (char)lVar18 + '\x01';
      }
      auVar38 = (auVar67 | _DAT_00179200) ^ _DAT_00179220;
      iVar44 = -(uint)(iVar68 < auVar38._0_4_);
      iVar56 = -(uint)(iVar69 < auVar38._4_4_);
      iVar55 = -(uint)(iVar42 < auVar38._8_4_);
      iVar57 = -(uint)(iVar43 < auVar38._12_4_);
      auVar63._4_4_ = iVar44;
      auVar63._0_4_ = iVar44;
      auVar63._8_4_ = iVar55;
      auVar63._12_4_ = iVar55;
      iVar44 = -(uint)(auVar38._4_4_ == iVar69);
      iVar55 = -(uint)(auVar38._12_4_ == iVar43);
      auVar72._4_4_ = iVar44;
      auVar72._0_4_ = iVar44;
      auVar72._8_4_ = iVar55;
      auVar72._12_4_ = iVar55;
      auVar64._4_4_ = iVar56;
      auVar64._0_4_ = iVar56;
      auVar64._8_4_ = iVar57;
      auVar64._12_4_ = iVar57;
      auVar38 = auVar72 & auVar63 | auVar64;
      auVar38 = packssdw(auVar38,auVar38);
      auVar58._8_4_ = 0xffffffff;
      auVar58._0_8_ = 0xffffffffffffffff;
      auVar58._12_4_ = 0xffffffff;
      auVar38 = packssdw(auVar38 ^ auVar58,auVar38 ^ auVar58);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38._0_4_ >> 0x10 & 1) != 0) {
        puVar12[-0xd0] = (char)lVar79 + '\x01';
      }
      auVar38 = pshufhw(auVar38,auVar63,0x84);
      auVar45 = pshufhw(auVar63,auVar72,0x84);
      auVar40 = pshufhw(auVar38,auVar64,0x84);
      auVar20._8_4_ = 0xffffffff;
      auVar20._0_8_ = 0xffffffffffffffff;
      auVar20._12_4_ = 0xffffffff;
      auVar20 = (auVar40 | auVar45 & auVar38) ^ auVar20;
      auVar38 = packssdw(auVar20,auVar20);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38._0_4_ >> 0x18 & 1) != 0) {
        puVar12[-0xc0] = (char)lVar80 + '\x01';
      }
      auVar38 = (auVar67 | _DAT_0017fa80) ^ _DAT_00179220;
      auVar59._0_4_ = -(uint)(iVar68 < auVar38._0_4_);
      auVar59._4_4_ = -(uint)(iVar69 < auVar38._4_4_);
      auVar59._8_4_ = -(uint)(iVar42 < auVar38._8_4_);
      auVar59._12_4_ = -(uint)(iVar43 < auVar38._12_4_);
      auVar73._4_4_ = auVar59._0_4_;
      auVar73._0_4_ = auVar59._0_4_;
      auVar73._8_4_ = auVar59._8_4_;
      auVar73._12_4_ = auVar59._8_4_;
      auVar45 = pshuflw(auVar64,auVar73,0xe8);
      auVar21._0_4_ = -(uint)(auVar38._0_4_ == iVar68);
      auVar21._4_4_ = -(uint)(auVar38._4_4_ == iVar69);
      auVar21._8_4_ = -(uint)(auVar38._8_4_ == iVar42);
      auVar21._12_4_ = -(uint)(auVar38._12_4_ == iVar43);
      auVar46._4_4_ = auVar21._4_4_;
      auVar46._0_4_ = auVar21._4_4_;
      auVar46._8_4_ = auVar21._12_4_;
      auVar46._12_4_ = auVar21._12_4_;
      auVar38 = pshuflw(auVar21,auVar46,0xe8);
      auVar47._4_4_ = auVar59._4_4_;
      auVar47._0_4_ = auVar59._4_4_;
      auVar47._8_4_ = auVar59._12_4_;
      auVar47._12_4_ = auVar59._12_4_;
      auVar40 = pshuflw(auVar59,auVar47,0xe8);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar38 = packssdw(auVar38 & auVar45,(auVar40 | auVar38 & auVar45) ^ auVar3);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        puVar12[-0xb0] = (char)lVar36 + '\x01';
      }
      auVar47 = auVar46 & auVar73 | auVar47;
      auVar40 = packssdw(auVar47,auVar47);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar38 = packssdw(auVar38,auVar40 ^ auVar4);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38._4_2_ >> 8 & 1) != 0) {
        puVar12[-0xa0] = (char)lVar37 + '\x01';
      }
      auVar38 = (auVar67 | _DAT_0017fa70) ^ _DAT_00179220;
      iVar44 = -(uint)(iVar68 < auVar38._0_4_);
      iVar56 = -(uint)(iVar69 < auVar38._4_4_);
      iVar55 = -(uint)(iVar42 < auVar38._8_4_);
      iVar57 = -(uint)(iVar43 < auVar38._12_4_);
      auVar48._4_4_ = iVar44;
      auVar48._0_4_ = iVar44;
      auVar48._8_4_ = iVar55;
      auVar48._12_4_ = iVar55;
      iVar44 = -(uint)(auVar38._4_4_ == iVar69);
      iVar55 = -(uint)(auVar38._12_4_ == iVar43);
      auVar65._4_4_ = iVar44;
      auVar65._0_4_ = iVar44;
      auVar65._8_4_ = iVar55;
      auVar65._12_4_ = iVar55;
      auVar74._4_4_ = iVar56;
      auVar74._0_4_ = iVar56;
      auVar74._8_4_ = iVar57;
      auVar74._12_4_ = iVar57;
      auVar38 = auVar65 & auVar48 | auVar74;
      auVar38 = packssdw(auVar38,auVar38);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar38 = packssdw(auVar38 ^ auVar5,auVar38 ^ auVar5);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        puVar12[-0x90] = (char)lVar34 + '\x01';
      }
      auVar38 = pshufhw(auVar38,auVar48,0x84);
      auVar45 = pshufhw(auVar48,auVar65,0x84);
      auVar40 = pshufhw(auVar38,auVar74,0x84);
      auVar22._8_4_ = 0xffffffff;
      auVar22._0_8_ = 0xffffffffffffffff;
      auVar22._12_4_ = 0xffffffff;
      auVar22 = (auVar40 | auVar45 & auVar38) ^ auVar22;
      auVar38 = packssdw(auVar22,auVar22);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38._6_2_ >> 8 & 1) != 0) {
        puVar12[-0x80] = (char)lVar35 + '\x01';
      }
      auVar38 = (auVar67 | _DAT_0017fa60) ^ _DAT_00179220;
      auVar60._0_4_ = -(uint)(iVar68 < auVar38._0_4_);
      auVar60._4_4_ = -(uint)(iVar69 < auVar38._4_4_);
      auVar60._8_4_ = -(uint)(iVar42 < auVar38._8_4_);
      auVar60._12_4_ = -(uint)(iVar43 < auVar38._12_4_);
      auVar75._4_4_ = auVar60._0_4_;
      auVar75._0_4_ = auVar60._0_4_;
      auVar75._8_4_ = auVar60._8_4_;
      auVar75._12_4_ = auVar60._8_4_;
      auVar45 = pshuflw(auVar65,auVar75,0xe8);
      auVar23._0_4_ = -(uint)(auVar38._0_4_ == iVar68);
      auVar23._4_4_ = -(uint)(auVar38._4_4_ == iVar69);
      auVar23._8_4_ = -(uint)(auVar38._8_4_ == iVar42);
      auVar23._12_4_ = -(uint)(auVar38._12_4_ == iVar43);
      auVar49._4_4_ = auVar23._4_4_;
      auVar49._0_4_ = auVar23._4_4_;
      auVar49._8_4_ = auVar23._12_4_;
      auVar49._12_4_ = auVar23._12_4_;
      auVar38 = pshuflw(auVar23,auVar49,0xe8);
      auVar50._4_4_ = auVar60._4_4_;
      auVar50._0_4_ = auVar60._4_4_;
      auVar50._8_4_ = auVar60._12_4_;
      auVar50._12_4_ = auVar60._12_4_;
      auVar40 = pshuflw(auVar60,auVar50,0xe8);
      auVar61._8_4_ = 0xffffffff;
      auVar61._0_8_ = 0xffffffffffffffff;
      auVar61._12_4_ = 0xffffffff;
      auVar61 = (auVar40 | auVar38 & auVar45) ^ auVar61;
      auVar40 = packssdw(auVar61,auVar61);
      auVar38 = packsswb(auVar38 & auVar45,auVar40);
      if ((auVar38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        puVar12[-0x70] = (char)lVar32 + '\x01';
      }
      auVar50 = auVar49 & auVar75 | auVar50;
      auVar40 = packssdw(auVar50,auVar50);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar40 = packssdw(auVar40 ^ auVar6,auVar40 ^ auVar6);
      auVar38 = packsswb(auVar38,auVar40);
      if ((auVar38._8_2_ >> 8 & 1) != 0) {
        puVar12[-0x60] = (char)lVar33 + '\x01';
      }
      auVar38 = (auVar67 | _DAT_0017fa50) ^ _DAT_00179220;
      iVar44 = -(uint)(iVar68 < auVar38._0_4_);
      iVar56 = -(uint)(iVar69 < auVar38._4_4_);
      iVar55 = -(uint)(iVar42 < auVar38._8_4_);
      iVar57 = -(uint)(iVar43 < auVar38._12_4_);
      auVar51._4_4_ = iVar44;
      auVar51._0_4_ = iVar44;
      auVar51._8_4_ = iVar55;
      auVar51._12_4_ = iVar55;
      iVar44 = -(uint)(auVar38._4_4_ == iVar69);
      iVar55 = -(uint)(auVar38._12_4_ == iVar43);
      auVar66._4_4_ = iVar44;
      auVar66._0_4_ = iVar44;
      auVar66._8_4_ = iVar55;
      auVar66._12_4_ = iVar55;
      auVar76._4_4_ = iVar56;
      auVar76._0_4_ = iVar56;
      auVar76._8_4_ = iVar57;
      auVar76._12_4_ = iVar57;
      auVar38 = auVar66 & auVar51 | auVar76;
      auVar38 = packssdw(auVar38,auVar38);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar38 = packssdw(auVar38 ^ auVar7,auVar38 ^ auVar7);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        puVar12[-0x50] = (char)lVar30 + '\x01';
      }
      auVar38 = pshufhw(auVar38,auVar51,0x84);
      auVar45 = pshufhw(auVar51,auVar66,0x84);
      auVar40 = pshufhw(auVar38,auVar76,0x84);
      auVar24._8_4_ = 0xffffffff;
      auVar24._0_8_ = 0xffffffffffffffff;
      auVar24._12_4_ = 0xffffffff;
      auVar24 = (auVar40 | auVar45 & auVar38) ^ auVar24;
      auVar38 = packssdw(auVar24,auVar24);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38._10_2_ >> 8 & 1) != 0) {
        puVar12[-0x40] = (char)lVar31 + '\x01';
      }
      auVar38 = (auVar67 | _DAT_0017fa40) ^ _DAT_00179220;
      auVar62._0_4_ = -(uint)(iVar68 < auVar38._0_4_);
      auVar62._4_4_ = -(uint)(iVar69 < auVar38._4_4_);
      auVar62._8_4_ = -(uint)(iVar42 < auVar38._8_4_);
      auVar62._12_4_ = -(uint)(iVar43 < auVar38._12_4_);
      auVar77._4_4_ = auVar62._0_4_;
      auVar77._0_4_ = auVar62._0_4_;
      auVar77._8_4_ = auVar62._8_4_;
      auVar77._12_4_ = auVar62._8_4_;
      auVar45 = pshuflw(auVar66,auVar77,0xe8);
      auVar25._0_4_ = -(uint)(auVar38._0_4_ == iVar68);
      auVar25._4_4_ = -(uint)(auVar38._4_4_ == iVar69);
      auVar25._8_4_ = -(uint)(auVar38._8_4_ == iVar42);
      auVar25._12_4_ = -(uint)(auVar38._12_4_ == iVar43);
      auVar52._4_4_ = auVar25._4_4_;
      auVar52._0_4_ = auVar25._4_4_;
      auVar52._8_4_ = auVar25._12_4_;
      auVar52._12_4_ = auVar25._12_4_;
      auVar38 = pshuflw(auVar25,auVar52,0xe8);
      auVar53._4_4_ = auVar62._4_4_;
      auVar53._0_4_ = auVar62._4_4_;
      auVar53._8_4_ = auVar62._12_4_;
      auVar53._12_4_ = auVar62._12_4_;
      auVar40 = pshuflw(auVar62,auVar53,0xe8);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar38 = packssdw(auVar38 & auVar45,(auVar40 | auVar38 & auVar45) ^ auVar8);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        puVar12[-0x30] = (char)lVar28 + '\x01';
      }
      auVar53 = auVar52 & auVar77 | auVar53;
      auVar40 = packssdw(auVar53,auVar53);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar38 = packssdw(auVar38,auVar40 ^ auVar9);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38._12_2_ >> 8 & 1) != 0) {
        puVar12[-0x20] = (char)lVar29 + '\x01';
      }
      auVar38 = (auVar67 | _DAT_0017fa30) ^ _DAT_00179220;
      auVar26._0_4_ = -(uint)(iVar68 < auVar38._0_4_);
      auVar26._4_4_ = -(uint)(iVar69 < auVar38._4_4_);
      auVar26._8_4_ = -(uint)(iVar42 < auVar38._8_4_);
      auVar26._12_4_ = -(uint)(iVar43 < auVar38._12_4_);
      auVar54._4_4_ = auVar26._0_4_;
      auVar54._0_4_ = auVar26._0_4_;
      auVar54._8_4_ = auVar26._8_4_;
      auVar54._12_4_ = auVar26._8_4_;
      iVar68 = -(uint)(auVar38._4_4_ == iVar69);
      iVar69 = -(uint)(auVar38._12_4_ == iVar43);
      auVar41._4_4_ = iVar68;
      auVar41._0_4_ = iVar68;
      auVar41._8_4_ = iVar69;
      auVar41._12_4_ = iVar69;
      in_XMM12._4_4_ = auVar26._4_4_;
      in_XMM12._0_4_ = auVar26._4_4_;
      in_XMM12._8_4_ = auVar26._12_4_;
      in_XMM12._12_4_ = auVar26._12_4_;
      in_XMM10 = auVar41 & auVar54 | in_XMM12;
      auVar38 = packssdw(auVar26,in_XMM10);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar38 = packssdw(auVar38 ^ auVar10,auVar38 ^ auVar10);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        puVar12[-0x10] = (char)lVar70 + '\x01';
      }
      auVar38 = pshufhw(auVar38,auVar54,0x84);
      auVar45 = pshufhw(auVar41,auVar41,0x84);
      auVar40 = pshufhw(auVar38,in_XMM12,0x84);
      auVar27._8_4_ = 0xffffffff;
      auVar27._0_8_ = 0xffffffffffffffff;
      auVar27._12_4_ = 0xffffffff;
      auVar27 = (auVar40 | auVar45 & auVar38) ^ auVar27;
      auVar38 = packssdw(auVar27,auVar27);
      auVar38 = packsswb(auVar38,auVar38);
      if ((auVar38._14_2_ >> 8 & 1) != 0) {
        *puVar12 = (char)lVar78 + '\x01';
      }
      uVar15 = uVar15 + 0x10;
      uVar17 = uVar17 + 0x10;
      lVar18 = lVar18 + 0x10;
      lVar79 = lVar79 + 0x10;
      lVar80 = lVar80 + 0x10;
      lVar36 = lVar36 + 0x10;
      lVar37 = lVar37 + 0x10;
      lVar34 = lVar34 + 0x10;
      lVar35 = lVar35 + 0x10;
      lVar32 = lVar32 + 0x10;
      lVar33 = lVar33 + 0x10;
      lVar30 = lVar30 + 0x10;
      lVar31 = lVar31 + 0x10;
      lVar28 = lVar28 + 0x10;
      lVar29 = lVar29 + 0x10;
      lVar70 = lVar70 + 0x10;
      lVar78 = lVar78 + 0x10;
      puVar12 = puVar12 + 0x100;
    } while ((lVar14 + 0xfU & 0xfffffffffffffff0) != uVar15);
  }
  if (this->entries != (Entry *)0x0) {
    operator_delete__(this->entries);
  }
  this->entries = pEVar11;
  this->allocated = (uchar)lVar16;
  return;
}

Assistant:

void addStorage()
    {
        Q_ASSERT(allocated < SpanConstants::NEntries);
        Q_ASSERT(nextFree == allocated);
        // the hash table should always be between 25 and 50% full
        // this implies that we on average have between 32 and 64 entries
        // in here. More exactly, we have a binominal distribution of the amount of
        // occupied entries.
        // For a 25% filled table, the average is 32 entries, with a 95% chance that we have between
        // 23 and 41 entries.
        // For a 50% filled table, the average is 64 entries, with a 95% chance that we have between
        // 53 and 75 entries.
        // Since we only resize the table once it's 50% filled and we want to avoid copies of
        // data where possible, we initially allocate 48 entries, then resize to 80 entries, after that
        // resize by increments of 16. That way, we usually only get one resize of the table
        // while filling it.
        size_t alloc;
        static_assert(SpanConstants::NEntries % 8 == 0);
        if (!allocated)
            alloc = SpanConstants::NEntries / 8 * 3;
        else if (allocated == SpanConstants::NEntries / 8 * 3)
            alloc = SpanConstants::NEntries / 8 * 5;
        else
            alloc = allocated + SpanConstants::NEntries/8;
        Entry *newEntries = new Entry[alloc];
        // we only add storage if the previous storage was fully filled, so
        // simply copy the old data over
        if constexpr (isRelocatable<Node>()) {
            if (allocated)
                memcpy(newEntries, entries, allocated * sizeof(Entry));
        } else {
            for (size_t i = 0; i < allocated; ++i) {
                new (&newEntries[i].node()) Node(std::move(entries[i].node()));
                entries[i].node().~Node();
            }
        }
        for (size_t i = allocated; i < alloc; ++i) {
            newEntries[i].nextFree() = uchar(i + 1);
        }
        delete[] entries;
        entries = newEntries;
        allocated = uchar(alloc);
    }